

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

void dlep_writer_add_ipv4_conpoint_tlv(dlep_writer *writer,netaddr *addr,uint16_t port,_Bool tls)

{
  undefined1 local_2a;
  undefined1 auStack_29 [4];
  uint8_t local_25 [2];
  byte local_23;
  uint8_t value [7];
  _Bool tls_local;
  uint16_t port_local;
  netaddr *addr_local;
  dlep_writer *writer_local;
  
  if (addr->_type == '\x02') {
    local_23 = tls;
    value._0_2_ = port;
    unique0x10000081 = addr;
    value._0_2_ = htons(port);
    local_2a = (local_23 & 1) != 0;
    netaddr_to_binary(auStack_29,stack0xffffffffffffffe0,7);
    local_25[0] = value[0];
    local_25[1] = value[1];
    dlep_writer_add_tlv(writer,2,&local_2a,7);
  }
  return;
}

Assistant:

void
dlep_writer_add_ipv4_conpoint_tlv(struct dlep_writer *writer, const struct netaddr *addr, uint16_t port, bool tls) {
  uint8_t value[7];

  if (netaddr_get_address_family(addr) != AF_INET) {
    return;
  }

  /* convert port to network byte order */
  port = htons(port);

  /* copy data into value buffer */
  value[0] = tls ? DLEP_CONNECTION_TLS : DLEP_CONNECTION_PLAIN;
  netaddr_to_binary(&value[1], addr, sizeof(value));
  memcpy(&value[5], &port, sizeof(port));

  dlep_writer_add_tlv(writer, DLEP_IPV4_CONPOINT_TLV, &value, sizeof(value));
}